

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall Abs<0,_0>::propagate(Abs<0,_0> *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  _func_int **pp_Var5;
  ulong uVar6;
  IntVar *pIVar7;
  int64_t m_v;
  long lVar8;
  long lVar9;
  long lVar10;
  
  pIVar7 = (this->x).var;
  iVar2 = (pIVar7->min).v;
  lVar8 = (long)iVar2;
  iVar4 = (pIVar7->max).v;
  lVar10 = (long)iVar4;
  if (lVar8 < 0) {
    if (iVar4 < 1) {
      lVar9 = (long)(((this->y).var)->min).v;
      if (SBORROW8(lVar9,-lVar10) != lVar9 + lVar10 < 0) {
        if (so.lazy) {
          iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[9])();
          lVar9 = (long)iVar2 * 4 + 2;
        }
        else {
          lVar9 = 0;
        }
        pIVar7 = (this->y).var;
        iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xe])(pIVar7,-lVar10,lVar9,1);
        if ((char)iVar2 == '\0') goto LAB_001af06f;
      }
      lVar9 = -lVar8;
      lVar10 = (long)(((this->y).var)->max).v;
      if (lVar10 != lVar9 && SBORROW8(lVar10,lVar9) == lVar10 + lVar8 < 0) {
        if (so.lazy != true) goto LAB_001aefb7;
        pIVar7 = (this->x).var;
LAB_001aef8f:
        iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[9])();
        uVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar6 = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
        lVar10 = lVar9;
        goto LAB_001aefb9;
      }
    }
    else {
      lVar9 = -lVar8;
      if (lVar10 != lVar9 && SBORROW8(lVar10,lVar9) == lVar10 + lVar8 < 0) {
        lVar9 = lVar10;
      }
      if (lVar9 < (((this->y).var)->max).v) {
        if (so.lazy) goto LAB_001aef8f;
LAB_001aefb7:
        uVar6 = 0;
        lVar10 = lVar9;
LAB_001aefb9:
        pIVar7 = (this->y).var;
        pp_Var5 = (pIVar7->super_Var).super_Branching._vptr_Branching;
        goto LAB_001aefc3;
      }
    }
LAB_001aefd3:
    pIVar7 = (this->y).var;
    iVar2 = (pIVar7->max).v;
    if (iVar2 < (((this->x).var)->max).v) {
      if (so.lazy == true) {
        iVar4 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[9])();
        lVar10 = (long)iVar4 * 4 + 2;
      }
      else {
        lVar10 = 0;
      }
      pIVar7 = (this->x).var;
      iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar7,(long)iVar2,lVar10,1);
      if ((char)iVar2 == '\0') goto LAB_001af06f;
    }
    pIVar7 = (this->y).var;
    lVar8 = (long)(pIVar7->max).v;
    lVar9 = -lVar8;
    lVar10 = (long)(((this->x).var)->min).v;
    if (SBORROW8(lVar10,lVar9) != lVar10 + lVar8 < 0) {
      if (so.lazy == true) {
        iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[9])();
        lVar10 = (long)iVar2 * 4 + 2;
      }
      else {
        lVar10 = 0;
      }
      pIVar7 = (this->x).var;
      iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xe])(pIVar7,lVar9,lVar10,1);
      if ((char)iVar2 == '\0') goto LAB_001af06f;
    }
    bVar1 = true;
  }
  else {
    if (iVar2 <= (((this->y).var)->min).v) {
LAB_001aeece:
      if (iVar4 < (((this->y).var)->max).v) {
        if (so.lazy == true) {
          iVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
          uVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
          uVar6 = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
        }
        else {
          uVar6 = 0;
        }
        pIVar7 = (this->y).var;
        pp_Var5 = (pIVar7->super_Var).super_Branching._vptr_Branching;
LAB_001aefc3:
        iVar2 = (*pp_Var5[0xf])(pIVar7,lVar10,uVar6,1);
        if ((char)iVar2 == '\0') goto LAB_001af06f;
      }
      goto LAB_001aefd3;
    }
    if (so.lazy) {
      iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[8])();
      lVar9 = (long)iVar2 * 4 + 2;
    }
    else {
      lVar9 = 0;
    }
    pIVar7 = (this->y).var;
    iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xe])(pIVar7,lVar8,lVar9,1);
    if ((char)iVar2 != '\0') goto LAB_001aeece;
LAB_001af06f:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool propagate() override {
		const int64_t l = x.getMin();
		const int64_t u = x.getMax();

		if (l >= 0) {
			setDom(y, setMin, l, x.getMinLit());
			setDom(y, setMax, u, x.getMinLit(), x.getMaxLit());
		} else if (u <= 0) {
			setDom(y, setMin, -u, x.getMaxLit());
			setDom(y, setMax, -l, x.getMaxLit(), x.getMinLit());
		} else {
			// Finesse stronger bound
			const int64_t t = (-l > u ? -l : u);
			setDom(y, setMax, t, x.getMaxLit(), x.getMinLit());
			//			setDom(y, setMax, t, x.getFMaxLit(t), x.getFMinLit(-t));
			//			setDom(y, setMax, t, x.getLit(t+1, LR_GE), x.getLit(-t-1, LR_LE));
		}

		setDom(x, setMax, y.getMax(), y.getMaxLit());
		setDom(x, setMin, -y.getMax(), y.getMaxLit());

		/*
				if (x.isFixed()) {
					if (x.getVal() < 0) {
						setDom(y, setMin, -x.getVal(), x.getMaxLit());
						setDom(y, setMax, -x.getVal(), x.getMinLit());
					} else if (x.getVal() > 0) {
						setDom(y, setMin, x.getVal(), x.getMinLit());
						setDom(y, setMax, x.getVal(), x.getMaxLit());
					} else {
						setDom(y, setVal, 0, x.getMinLit(), x.getMaxLit());
					}
				}
		*/

		return true;
	}